

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyz::ChNodeFEAxyz(ChNodeFEAxyz *this,ChVector<double> *initial_pos)

{
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0xe8);
  *(undefined ***)&(this->super_ChNodeFEAbase).field_0x18 = &PTR__ChLoadable_00b2c638;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb54048;
  *(undefined8 *)&this->field_0xe8 = 0xb54148;
  ChNodeXYZ::ChNodeXYZ
            ((ChNodeXYZ *)&(this->super_ChNodeFEAbase).field_0x18,
             &PTR_construction_vtable_128__00b53ff0,initial_pos);
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb53be8;
  *(undefined8 *)&this->field_0xe8 = 0xb53f20;
  *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x18 = 0xb53d80;
  (this->super_ChVariableTupleCarrier_1vars<3>)._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x280);
  ChVariablesNode::ChVariablesNode(&this->variables);
  (this->X0).m_data[0] = initial_pos->m_data[0];
  (this->X0).m_data[1] = initial_pos->m_data[1];
  (this->X0).m_data[2] = initial_pos->m_data[2];
  (this->Force).m_data[0] = VNULL;
  (this->Force).m_data[1] = DAT_00b90ac0;
  (this->Force).m_data[2] = DAT_00b90ac8;
  (this->variables).mass = 0.0;
  return;
}

Assistant:

ChNodeFEAxyz::ChNodeFEAxyz(ChVector<> initial_pos) : ChNodeXYZ(initial_pos), X0(initial_pos), Force(VNULL) {
    variables.SetNodeMass(0);
}